

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

bool __thiscall
slang::ast::UnaryExpression::propagateType(UnaryExpression *this,ASTContext *context,Type *newType)

{
  bool bVar1;
  logic_error *this_00;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (this->op - BitwiseAnd < 0xb) {
    bVar1 = false;
  }
  else {
    if (BitwiseNot < this->op) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
                 ,&local_e9);
      std::operator+(&local_68,&local_88,":");
      std::__cxx11::to_string(&local_a8,0x1b5);
      std::operator+(&local_48,&local_68,&local_a8);
      std::operator+(&local_e8,&local_48,": ");
      std::operator+(&local_c8,&local_e8,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_c8);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    local_e8._M_dataplus._M_p = (pointer)newType;
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
              ((not_null<slang::ast::Type_const*> *)&local_c8,(Type **)&local_e8);
    (this->super_Expression).type.ptr = (Type *)local_c8._M_dataplus._M_p;
    Expression::contextDetermined(context,&this->operand_,newType,(SourceLocation)0x0);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool UnaryExpression::propagateType(const ASTContext& context, const Type& newType) {
    switch (op) {
        case UnaryOperator::Plus:
        case UnaryOperator::Minus:
        case UnaryOperator::BitwiseNot:
            type = &newType;
            contextDetermined(context, operand_, newType);
            return true;
        case UnaryOperator::BitwiseAnd:
        case UnaryOperator::BitwiseOr:
        case UnaryOperator::BitwiseXor:
        case UnaryOperator::BitwiseNand:
        case UnaryOperator::BitwiseNor:
        case UnaryOperator::BitwiseXnor:
        case UnaryOperator::LogicalNot:
        case UnaryOperator::Preincrement:
        case UnaryOperator::Predecrement:
        case UnaryOperator::Postincrement:
        case UnaryOperator::Postdecrement:
            // Operand is self determined and already folded.
            return false;
    }
    ASSUME_UNREACHABLE;
}